

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

void __thiscall MakefileGenerator::writePrlFile(MakefileGenerator *this,QTextStream *t)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  bool bVar4;
  QTextStream *pQVar5;
  ProStringList *pPVar6;
  iterator iVar7;
  iterator iVar8;
  QString *pQVar9;
  char *str;
  QMakeProject *pQVar10;
  long in_FS_OFFSET;
  ProString local_138;
  ProString local_108;
  QArrayDataPointer<ProString> local_d8;
  ProString local_b8;
  ProString local_88;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  qVar1 = Option::output_dir.d.size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = Option::output_dir.d.d;
  local_58.ptr = Option::output_dir.d.ptr;
  local_58.size = Option::output_dir.d.size;
  if (Option::output_dir.d.d != (Data *)0x0) {
    LOCK();
    ((Option::output_dir.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((Option::output_dir.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         1;
    UNLOCK();
  }
  if (qVar1 == 0) {
    qmake_getpwd();
    pcVar3 = local_58.ptr;
    pDVar2 = local_58.d;
    local_58.d = local_88.m_string.d.d;
    local_58.ptr = local_88.m_string.d.ptr;
    local_88.m_string.d.d = pDVar2;
    local_88.m_string.d.ptr = pcVar3;
    local_58.size = local_88.m_string.d.size;
    local_88.m_string.d.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  }
  pQVar5 = (QTextStream *)QTextStream::operator<<(t,"QMAKE_PRL_BUILD_DIR =");
  ProString::ProString(&local_88,(QString *)&local_58);
  qv(&local_b8.m_string,&local_88);
  pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)&local_b8);
  Qt::endl(pQVar5);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  pQVar5 = (QTextStream *)QTextStream::operator<<(t,"QMAKE_PRO_INPUT =");
  pQVar10 = this->project;
  local_138.m_string.d.d = (pQVar10->m_projectFile).d.d;
  local_138.m_string.d.ptr = (pQVar10->m_projectFile).d.ptr;
  local_138.m_string.d.size = (pQVar10->m_projectFile).d.size;
  if (local_138.m_string.d.d != (Data *)0x0) {
    LOCK();
    ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         1;
    UNLOCK();
  }
  QString::section(&local_108.m_string,&local_138.m_string,(QChar)0x2f,-1,-1,(SectionFlags)0x0);
  ProString::ProString(&local_88,&local_108.m_string);
  qv(&local_b8.m_string,&local_88);
  pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)&local_b8);
  Qt::endl(pQVar5);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_138);
  pQVar10 = this->project;
  ProKey::ProKey((ProKey *)&local_88,"QMAKE_ABSOLUTE_SOURCE_PATH");
  bVar4 = QMakeProject::isEmpty(pQVar10,(ProKey *)&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  if (!bVar4) {
    pQVar5 = (QTextStream *)QTextStream::operator<<(t,"QMAKE_PRL_SOURCE_DIR =");
    pQVar10 = this->project;
    ProKey::ProKey((ProKey *)&local_b8,"QMAKE_ABSOLUTE_SOURCE_PATH");
    QMakeEvaluator::first(&local_88,&pQVar10->super_QMakeEvaluator,(ProKey *)&local_b8);
    qv(&local_108.m_string,&local_88);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)&local_108);
    Qt::endl(pQVar5);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
  }
  pQVar5 = (QTextStream *)QTextStream::operator<<(t,"QMAKE_PRL_TARGET =");
  pQVar10 = this->project;
  ProKey::ProKey((ProKey *)&local_b8,"LIB_TARGET");
  QMakeEvaluator::first(&local_88,&pQVar10->super_QMakeEvaluator,(ProKey *)&local_b8);
  qv(&local_108.m_string,&local_88);
  pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)&local_108);
  Qt::endl(pQVar5);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
  pQVar10 = this->project;
  ProKey::ProKey((ProKey *)&local_88,"PRL_EXPORT_DEFINES");
  bVar4 = QMakeProject::isEmpty(pQVar10,(ProKey *)&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  if (!bVar4) {
    pQVar5 = (QTextStream *)QTextStream::operator<<(t,"QMAKE_PRL_DEFINES =");
    pQVar10 = this->project;
    ProKey::ProKey((ProKey *)&local_88,"PRL_EXPORT_DEFINES");
    pPVar6 = QMakeEvaluator::valuesRef(&pQVar10->super_QMakeEvaluator,(ProKey *)&local_88);
    qv(&local_b8.m_string,pPVar6);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)&local_b8);
    Qt::endl(pQVar5);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  }
  pQVar10 = this->project;
  ProKey::ProKey((ProKey *)&local_88,"PRL_EXPORT_CFLAGS");
  bVar4 = QMakeProject::isEmpty(pQVar10,(ProKey *)&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  if (!bVar4) {
    pQVar5 = (QTextStream *)QTextStream::operator<<(t,"QMAKE_PRL_CFLAGS =");
    pQVar10 = this->project;
    ProKey::ProKey((ProKey *)&local_88,"PRL_EXPORT_CFLAGS");
    pPVar6 = QMakeEvaluator::valuesRef(&pQVar10->super_QMakeEvaluator,(ProKey *)&local_88);
    qv(&local_b8.m_string,pPVar6);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)&local_b8);
    Qt::endl(pQVar5);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  }
  pQVar10 = this->project;
  ProKey::ProKey((ProKey *)&local_88,"PRL_EXPORT_CXXFLAGS");
  bVar4 = QMakeProject::isEmpty(pQVar10,(ProKey *)&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  if (!bVar4) {
    pQVar5 = (QTextStream *)QTextStream::operator<<(t,"QMAKE_PRL_CXXFLAGS =");
    pQVar10 = this->project;
    ProKey::ProKey((ProKey *)&local_88,"PRL_EXPORT_CXXFLAGS");
    pPVar6 = QMakeEvaluator::valuesRef(&pQVar10->super_QMakeEvaluator,(ProKey *)&local_88);
    qv(&local_b8.m_string,pPVar6);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)&local_b8);
    Qt::endl(pQVar5);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  }
  pQVar10 = this->project;
  ProKey::ProKey((ProKey *)&local_88,"CONFIG");
  bVar4 = QMakeProject::isEmpty(pQVar10,(ProKey *)&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  if (!bVar4) {
    pQVar5 = (QTextStream *)QTextStream::operator<<(t,"QMAKE_PRL_CONFIG =");
    pQVar10 = this->project;
    ProKey::ProKey((ProKey *)&local_88,"CONFIG");
    pPVar6 = QMakeEvaluator::valuesRef(&pQVar10->super_QMakeEvaluator,(ProKey *)&local_88);
    qv(&local_b8.m_string,pPVar6);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)&local_b8);
    Qt::endl(pQVar5);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  }
  pQVar10 = this->project;
  ProKey::ProKey((ProKey *)&local_88,"TARGET_VERSION_EXT");
  bVar4 = QMakeProject::isEmpty(pQVar10,(ProKey *)&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  if (bVar4) {
    pQVar10 = this->project;
    ProKey::ProKey((ProKey *)&local_88,"VERSION");
    bVar4 = QMakeProject::isEmpty(pQVar10,(ProKey *)&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    if (!bVar4) {
      pQVar5 = (QTextStream *)QTextStream::operator<<(t,"QMAKE_PRL_VERSION = ");
      pQVar10 = this->project;
      str = "VERSION";
      goto LAB_00146841;
    }
  }
  else {
    pQVar5 = (QTextStream *)QTextStream::operator<<(t,"QMAKE_PRL_VERSION = ");
    pQVar10 = this->project;
    str = "TARGET_VERSION_EXT";
LAB_00146841:
    ProKey::ProKey((ProKey *)&local_b8,str);
    QMakeEvaluator::first(&local_88,&pQVar10->super_QMakeEvaluator,(ProKey *)&local_b8);
    pQVar5 = operator<<(pQVar5,&local_88);
    Qt::endl(pQVar5);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
  }
  pQVar10 = this->project;
  QString::QString(&local_88.m_string,"staticlib");
  bVar4 = QMakeProject::isActiveConfig(pQVar10,&local_88.m_string,false);
  if (bVar4) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  }
  else {
    pQVar10 = this->project;
    QString::QString(&local_b8.m_string,"explicitlib");
    bVar4 = QMakeProject::isActiveConfig(pQVar10,&local_b8.m_string,false);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    if (!bVar4) goto LAB_00146bb4;
  }
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (ProString *)0x0;
  local_d8.size = 0;
  pQVar10 = this->project;
  QString::QString(&local_88.m_string,"staticlib");
  bVar4 = QMakeProject::isActiveConfig(pQVar10,&local_88.m_string,false);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  if (bVar4) {
    ProString::ProString(&local_88,"LIBS");
    QList<ProString>::emplaceBack<ProString_const&>((QList<ProString> *)&local_d8,&local_88);
    ProString::ProString(&local_b8,"LIBS_PRIVATE");
    QList<ProString>::emplaceBack<ProString_const&>((QList<ProString> *)&local_d8,&local_b8);
    ProString::ProString(&local_108,"QMAKE_LIBS");
    QList<ProString>::emplaceBack<ProString_const&>((QList<ProString> *)&local_d8,&local_108);
    ProString::ProString(&local_138,"QMAKE_LIBS_PRIVATE");
    QList<ProString>::emplaceBack<ProString_const&>((QList<ProString> *)&local_d8,&local_138);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_138);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
  }
  else {
    ProString::ProString(&local_88,"LIBS");
    QList<ProString>::emplaceBack<ProString_const&>((QList<ProString> *)&local_d8,&local_88);
    ProString::ProString(&local_b8,"QMAKE_LIBS");
    QList<ProString>::emplaceBack<ProString_const&>((QList<ProString> *)&local_d8,&local_b8);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  QTextStream::operator<<(t,"QMAKE_PRL_LIBS =");
  iVar7 = QList<ProString>::begin((QList<ProString> *)&local_d8);
  while( true ) {
    iVar8 = QList<ProString>::end((QList<ProString> *)&local_d8);
    if (iVar7.i == iVar8.i) break;
    pPVar6 = QMakeEvaluator::valuesRef(&this->project->super_QMakeEvaluator,(ProKey *)iVar7.i);
    qv(&local_88.m_string,pPVar6);
    QTextStream::operator<<(t,(QString *)&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    iVar7.i = iVar7.i + 1;
  }
  Qt::endl(t);
  QTextStream::operator<<(t,"QMAKE_PRL_LIBS_FOR_CMAKE = ");
  local_88.m_string.d.d = (Data *)0x0;
  local_88.m_string.d.ptr = (char16_t *)0x0;
  local_88.m_string.d.size = 0;
  iVar7 = QList<ProString>::begin((QList<ProString> *)&local_d8);
  while( true ) {
    iVar8 = QList<ProString>::end((QList<ProString> *)&local_d8);
    if (iVar7.i == iVar8.i) break;
    pQVar5 = (QTextStream *)QTextStream::operator<<(t,(QString *)&local_88);
    pPVar6 = QMakeEvaluator::valuesRef(&this->project->super_QMakeEvaluator,(ProKey *)iVar7.i);
    ProStringList::join(&local_b8.m_string,pPVar6,(QChar)0x3b);
    QString::QString(&local_108.m_string,"\\\\");
    pQVar9 = (QString *)
             QString::replace((QChar)(char16_t)&local_b8,(QString *)0x5c,(CaseSensitivity)&local_108
                             );
    QTextStream::operator<<(pQVar5,pQVar9);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
    QString::operator=(&local_88.m_string,(QChar)0x3b);
    iVar7.i = iVar7.i + 1;
  }
  Qt::endl(t);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_d8);
LAB_00146bb4:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
MakefileGenerator::writePrlFile(QTextStream &t)
{
    QString bdir = Option::output_dir;
    if(bdir.isEmpty())
        bdir = qmake_getpwd();
    t << "QMAKE_PRL_BUILD_DIR =" << qv(bdir) << Qt::endl;

    t << "QMAKE_PRO_INPUT =" << qv(project->projectFile().section('/', -1)) << Qt::endl;

    if(!project->isEmpty("QMAKE_ABSOLUTE_SOURCE_PATH"))
        t << "QMAKE_PRL_SOURCE_DIR =" << qv(project->first("QMAKE_ABSOLUTE_SOURCE_PATH")) << Qt::endl;
    t << "QMAKE_PRL_TARGET =" << qv(project->first("LIB_TARGET")) << Qt::endl;
    if(!project->isEmpty("PRL_EXPORT_DEFINES"))
        t << "QMAKE_PRL_DEFINES =" << qv(project->values("PRL_EXPORT_DEFINES")) << Qt::endl;
    if(!project->isEmpty("PRL_EXPORT_CFLAGS"))
        t << "QMAKE_PRL_CFLAGS =" << qv(project->values("PRL_EXPORT_CFLAGS")) << Qt::endl;
    if(!project->isEmpty("PRL_EXPORT_CXXFLAGS"))
        t << "QMAKE_PRL_CXXFLAGS =" << qv(project->values("PRL_EXPORT_CXXFLAGS")) << Qt::endl;
    if(!project->isEmpty("CONFIG"))
        t << "QMAKE_PRL_CONFIG =" << qv(project->values("CONFIG")) << Qt::endl;
    if(!project->isEmpty("TARGET_VERSION_EXT"))
        t << "QMAKE_PRL_VERSION = " << project->first("TARGET_VERSION_EXT") << Qt::endl;
    else if(!project->isEmpty("VERSION"))
        t << "QMAKE_PRL_VERSION = " << project->first("VERSION") << Qt::endl;
    if(project->isActiveConfig("staticlib") || project->isActiveConfig("explicitlib")) {
        ProStringList libs;
        if (!project->isActiveConfig("staticlib"))
            libs << "LIBS" << "QMAKE_LIBS";
        else
            libs << "LIBS" << "LIBS_PRIVATE" << "QMAKE_LIBS" << "QMAKE_LIBS_PRIVATE";
        t << "QMAKE_PRL_LIBS =";
        for (ProStringList::Iterator it = libs.begin(); it != libs.end(); ++it)
            t << qv(project->values((*it).toKey()));
        t << Qt::endl;

        t << "QMAKE_PRL_LIBS_FOR_CMAKE = ";
        QString sep;
        for (ProStringList::Iterator it = libs.begin(); it != libs.end(); ++it) {
            t << sep << project->values((*it).toKey()).join(';').replace('\\', "\\\\");
            sep = ';';
        }
        t << Qt::endl;
    }
}